

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast-check.cpp
# Opt level: O2

void __thiscall
wasm::CastCheckTest_CastToSub_Test::~CastCheckTest_CastToSub_Test
          (CastCheckTest_CastToSub_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F(CastCheckTest, CastToSub) {
#define EXPECT_CAST(                                                           \
  srcNullability, srcExactness, castNullability, castExactness, result)        \
  EXPECT_EQ(evaluateCastCheck(Type(super, srcNullability, srcExactness),       \
                              Type(sub, castNullability, castExactness)),      \
            result);

  EXPECT_CAST(Nullable, Inexact, Nullable, Inexact, Unknown);
  EXPECT_CAST(Nullable, Inexact, Nullable, Exact, Unknown);
  EXPECT_CAST(Nullable, Inexact, NonNullable, Inexact, Unknown);
  EXPECT_CAST(Nullable, Inexact, NonNullable, Exact, Unknown);
  EXPECT_CAST(Nullable, Exact, Nullable, Inexact, SuccessOnlyIfNull);
  EXPECT_CAST(Nullable, Exact, Nullable, Exact, SuccessOnlyIfNull);
  EXPECT_CAST(Nullable, Exact, NonNullable, Inexact, Failure);
  EXPECT_CAST(Nullable, Exact, NonNullable, Exact, Failure);
  EXPECT_CAST(NonNullable, Inexact, Nullable, Inexact, Unknown);
  EXPECT_CAST(NonNullable, Inexact, Nullable, Exact, Unknown);
  EXPECT_CAST(NonNullable, Inexact, NonNullable, Inexact, Unknown);
  EXPECT_CAST(NonNullable, Inexact, NonNullable, Exact, Unknown);
  EXPECT_CAST(NonNullable, Exact, Nullable, Inexact, Failure);
  EXPECT_CAST(NonNullable, Exact, Nullable, Exact, Failure);
  EXPECT_CAST(NonNullable, Exact, NonNullable, Inexact, Failure);
  EXPECT_CAST(NonNullable, Exact, NonNullable, Exact, Failure);
#undef EXPECT_CAST
}